

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpticalFlowFrameToFrame.h
# Opt level: O2

void __thiscall
vo::OpticalFlowFrameToFrame<float,_vo::Pattern51>::trackPoints
          (OpticalFlowFrameToFrame<float,_vo::Pattern51> *this,
          ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_> *pyr_1,
          ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_> *pyr_2,
          aligned_map<KeypointId,_Eigen::AffineCompact2f> *transform_map_1,
          aligned_map<KeypointId,_Eigen::AffineCompact2f> *transform_map_2)

{
  size_type __n;
  _Base_ptr p_Var1;
  aligned_vector<Eigen::AffineCompact2f> init_vec;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ids;
  blocked_range<unsigned_long> range;
  anon_class_48_6_1519dfa4 compute_func;
  concurrent_unordered_map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>
  result;
  vector<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
  local_328;
  OpticalFlowFrameToFrame<float,_vo::Pattern51> *local_310;
  ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_> *local_308;
  ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_> *local_300;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_2f8;
  solist_iterator<tbb::detail::d1::concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>,_std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>
  local_2d8;
  solist_iterator<tbb::detail::d1::concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>,_std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>
  local_2d0;
  blocked_range<unsigned_long> local_2c8;
  anon_class_48_6_1519dfa4 local_2b0;
  concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>
  local_280;
  
  __n = (transform_map_1->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_2f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328.
  super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.
  super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.
  super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_310 = this;
  local_308 = pyr_1;
  local_300 = pyr_2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2f8,__n);
  std::
  vector<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
  ::reserve(&local_328,__n);
  for (p_Var1 = (transform_map_1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(transform_map_1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2f8,
               (value_type_conflict3 *)(p_Var1 + 1));
    std::
    vector<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
    ::push_back(&local_328,(value_type *)&p_Var1[1]._M_parent);
  }
  tbb::detail::d1::
  concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>
  ::concurrent_unordered_base(&local_280);
  local_2b0.this = local_310;
  local_2b0.pyr_1 = local_308;
  local_2b0.pyr_2 = local_300;
  local_2c8.my_begin = 0;
  local_2c8.my_grainsize = 1;
  local_2c8.my_end = __n;
  local_2b0.ids = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2f8;
  local_2b0.init_vec = &local_328;
  local_2b0.result =
       (concurrent_unordered_map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>
        *)&local_280;
  tbb::detail::d1::
  parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,vo::OpticalFlowFrameToFrame<float,vo::Pattern51>::trackPoints(vo::ManagedImagePyr<unsigned_short,std::allocator<unsigned_short>>const&,vo::ManagedImagePyr<unsigned_short,std::allocator<unsigned_short>>const&,std::map<unsigned_long,Eigen::Transform<float,2,18,0>,std::less<unsigned_long>,Eigen::aligned_allocator<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>>const&,std::map<unsigned_long,Eigen::Transform<float,2,18,0>,std::less<unsigned_long>,Eigen::aligned_allocator<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>>&)const::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
            (&local_2c8,&local_2b0);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>,_std::_Select1st<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_std::less<unsigned_long>,_Eigen::aligned_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>
  ::clear(&transform_map_2->_M_t);
  local_2d0.my_node_ptr =
       tbb::detail::d1::
       concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>
       ::first_value_node(&local_280,&local_280.my_head);
  local_2d8.my_node_ptr = (node_ptr)0x0;
  std::
  map<unsigned_long,Eigen::Transform<float,2,18,0>,std::less<unsigned_long>,Eigen::aligned_allocator<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>>
  ::
  insert<tbb::detail::d1::solist_iterator<tbb::detail::d1::concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,Eigen::Transform<float,2,18,0>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,tbb::detail::d1::tbb_allocator<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>,false>>,std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>>
            ((map<unsigned_long,Eigen::Transform<float,2,18,0>,std::less<unsigned_long>,Eigen::aligned_allocator<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>>
              *)transform_map_2,&local_2d0,&local_2d8);
  tbb::detail::d1::
  concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>
  ::~concurrent_unordered_base(&local_280);
  free(local_328.
       super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
       ._M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_2f8);
  return;
}

Assistant:

void trackPoints(const vo::ManagedImagePyr<u_int16_t>& pyr_1,
                   const vo::ManagedImagePyr<u_int16_t>& pyr_2,
                   const Eigen::aligned_map<KeypointId, Eigen::AffineCompact2f>&
                       transform_map_1,
                   Eigen::aligned_map<KeypointId, Eigen::AffineCompact2f>&
                       transform_map_2) const {
    size_t num_points = transform_map_1.size();

    std::vector<KeypointId> ids;
    Eigen::aligned_vector<Eigen::AffineCompact2f> init_vec;

    ids.reserve(num_points);
    init_vec.reserve(num_points);

    for (const auto& kv : transform_map_1) {
      ids.push_back(kv.first);
      init_vec.push_back(kv.second);
    }

    tbb::concurrent_unordered_map<KeypointId, Eigen::AffineCompact2f,
                                  std::hash<KeypointId>>
        result;

    auto compute_func = [&](const tbb::blocked_range<size_t>& range) {
      for (size_t r = range.begin(); r != range.end(); ++r) {
        const KeypointId id = ids[r];

        const Eigen::AffineCompact2f& transform_1 = init_vec[r];
        Eigen::AffineCompact2f transform_2 = transform_1;

        bool valid = trackPoint(pyr_1, pyr_2, transform_1, transform_2);

        if (valid) {
          Eigen::AffineCompact2f transform_1_recovered = transform_2;

          valid = trackPoint(pyr_2, pyr_1, transform_2, transform_1_recovered);

          if (valid) {
            Scalar dist2 = (transform_1.translation() -
                            transform_1_recovered.translation())
                               .squaredNorm();

            if (dist2 < optical_flow_max_recovered_dist2) {
              result[id] = transform_2;
            }
          }
        }
      }
    };

    tbb::blocked_range<size_t> range(0, num_points);

    tbb::parallel_for(range, compute_func);
    // compute_func(range);

    transform_map_2.clear();
    transform_map_2.insert(result.begin(), result.end());
  }